

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relative_entropy.c
# Opt level: O3

double inform_relative_entropy(int *xs,int *ys,size_t n,int b,inform_error *err)

{
  uint32_t *puVar1;
  uint32_t *puVar2;
  _Bool _Var3;
  inform_dist *dist;
  inform_dist *q;
  size_t sVar4;
  double dVar5;
  
  _Var3 = check_arguments(xs,ys,n,b,err);
  if (!_Var3) {
    dist = inform_dist_alloc((long)b);
    if (dist != (inform_dist *)0x0) {
      q = inform_dist_alloc((long)b);
      if (q != (inform_dist *)0x0) {
        dist->counts = n;
        q->counts = n;
        if (n != 0) {
          puVar1 = dist->histogram;
          puVar2 = q->histogram;
          sVar4 = 0;
          do {
            puVar1[xs[sVar4]] = puVar1[xs[sVar4]] + 1;
            puVar2[ys[sVar4]] = puVar2[ys[sVar4]] + 1;
            sVar4 = sVar4 + 1;
          } while (n != sVar4);
        }
        dVar5 = inform_shannon_re(dist,q,2.0);
        inform_dist_free(dist);
        inform_dist_free(q);
        return dVar5;
      }
      inform_dist_free(dist);
    }
    if (err != (inform_error *)0x0) {
      *err = INFORM_ENOMEM;
    }
  }
  return NAN;
}

Assistant:

double inform_relative_entropy(int const *xs, int const *ys, size_t n, int b,
    inform_error *err)
{
    if (check_arguments(xs, ys, n, b, err)) return NAN;

    inform_dist *x = NULL, *y = NULL;
    if (allocate(b, &x, &y, err)) return NAN;

    accumulate(xs, ys, n, x, y);

    double re = inform_shannon_re(x, y, 2.0);

    free_all(&x, &y);

    return re;
}